

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::runContinuation(QFutureInterfaceBase *this)

{
  QFutureInterfaceBasePrivate *pQVar1;
  _Manager_type p_Var2;
  QBasicMutex *this_00;
  long in_FS_OFFSET;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &this->d->continuationMutex;
  local_30._0_8_ = this_00;
  QBasicMutex::lock(this_00);
  local_30[8] = true;
  pQVar1 = this->d;
  p_Var2 = (pQVar1->continuation).super__Function_base._M_manager;
  if ((p_Var2 != (_Manager_type)0x0) && (pQVar1->continuationExecuted == false)) {
    if (pQVar1->continuationData != (QFutureInterfaceBasePrivate *)0x0) {
      pQVar1->continuationData->nonConcludedParent = (QFutureInterfaceBasePrivate *)0x0;
    }
    pQVar1->continuationExecuted = true;
    local_40 = (pQVar1->continuation)._M_invoker;
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pQVar1->continuation).super__Function_base._M_functor;
    local_58._8_8_ =
         *(undefined8 *)((long)&(pQVar1->continuation).super__Function_base._M_functor + 8);
    (pQVar1->continuation).super__Function_base._M_manager = (_Manager_type)0x0;
    (pQVar1->continuation)._M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
    QBasicMutex::unlock(this_00);
    local_30[8] = false;
    std::function<void_(const_QFutureInterfaceBase_&)>::operator()
              ((function<void_(const_QFutureInterfaceBase_&)> *)&local_58,this);
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    if ((this->d->continuationState)._M_i != Cleaned) {
      std::function<void_(const_QFutureInterfaceBase_&)>::operator=
                (&this->d->continuation,(function<void_(const_QFutureInterfaceBase_&)> *)&local_58);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::runContinuation() const
{
    QMutexLocker lock(&d->continuationMutex);
    if (d->continuation && !d->continuationExecuted) {
        // If we run the next continuation, then this future is concluded, so
        // we wouldn't need to revisit it in the cancelChain()
        if (d->continuationData)
            d->continuationData->nonConcludedParent = nullptr;
        // Save the continuation in a local function, to avoid calling
        // a null std::function below, in case cleanContinuation() is
        // called from some other thread right after unlock() below.
        d->continuationExecuted = true;
        auto fn = std::move(d->continuation);
        lock.unlock();
        fn(*this);

        lock.relock();
        // Unless the continuation has been cleaned earlier, we have to
        // store the move-only continuation, to guarantee that the associated
        // future's data stays alive.
        if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned)
            d->continuation = std::move(fn);
    }
}